

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

ElabSystemTaskSymbol * __thiscall
slang::ast::ElabSystemTaskSymbol::fromSyntax
          (ElabSystemTaskSymbol *this,Compilation *compilation,ElabSystemTaskSyntax *syntax)

{
  ElabSystemTaskSymbol *pEVar1;
  Token token;
  ElabSystemTaskKind taskKind;
  ElabSystemTaskKind local_2c;
  SourceLocation local_28;
  
  token.info = (Info *)syntax;
  token._0_8_ = (compilation->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .num_slots_minus_one;
  local_2c = SemanticFacts::getElabSystemTaskKind
                       ((SemanticFacts *)
                        (compilation->options).topModules.
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        .entries,token);
  local_28 = parsing::Token::location((Token *)&(compilation->options).topModules);
  pEVar1 = BumpAllocator::
           emplace<slang::ast::ElabSystemTaskSymbol,slang::ast::ElabSystemTaskKind&,slang::SourceLocation>
                     ((BumpAllocator *)this,&local_2c,&local_28);
  (pEVar1->super_Symbol).originatingSyntax = (SyntaxNode *)compilation;
  return pEVar1;
}

Assistant:

ElabSystemTaskSymbol& ElabSystemTaskSymbol::fromSyntax(Compilation& compilation,
                                                       const ElabSystemTaskSyntax& syntax) {
    // Just create the symbol now. The diagnostic will be issued later
    // when someone visits the symbol and asks for it.
    auto taskKind = SemanticFacts::getElabSystemTaskKind(syntax.name);
    auto result = compilation.emplace<ElabSystemTaskSymbol>(taskKind, syntax.name.location());
    result->setSyntax(syntax);
    return *result;
}